

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

void __thiscall mocker::ir::Builder::translateLogicBinary(Builder *this,BinaryExpr *node)

{
  bool bVar1;
  _List_node_base *p_Var2;
  FunctionModule *pFVar3;
  BuilderContext *hint;
  BuilderContext *pBVar4;
  size_type sVar5;
  element_type *peVar6;
  bool bVar7;
  undefined7 uVar8;
  undefined8 uVar9;
  BBLIter BVar10;
  BBLIter BVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  shared_ptr<mocker::ir::Jump> jumpSucc;
  shared_ptr<mocker::ir::Label> succLabel;
  shared_ptr<mocker::ir::Reg> boolExpAddr;
  shared_ptr<mocker::ir::Reg> val;
  Defer undo;
  undefined1 local_199;
  undefined1 local_198 [16];
  undefined1 local_188 [24];
  FunctionModule *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  BinaryExpr *local_158;
  shared_ptr<mocker::ir::IntLiteral> local_150;
  shared_ptr<mocker::ir::Label> local_140;
  undefined1 local_130 [32];
  BBLIter local_110;
  undefined1 local_108 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  shared_ptr<mocker::ir::IRInst> local_e8;
  shared_ptr<mocker::ir::Addr> local_d8;
  Builder *local_c8;
  __node_base _Stack_c0;
  __node_base_ptr local_b8;
  ASTIDMap<std::shared_ptr<ast::Type>_> *pAStack_b0;
  _List_node_base *local_a0;
  shared_ptr<mocker::ir::IRInst> local_98;
  shared_ptr<mocker::ir::IRInst> local_88;
  shared_ptr<mocker::ir::IRInst> local_78;
  shared_ptr<mocker::ir::IRInst> local_68;
  _Any_data local_58;
  _Map_pointer local_48;
  _Elt_pointer psStack_40;
  
  if ((this->ctx->logicalExprInfo).inCondition == false) {
    translateEscapedLogicBinary(this,node);
    return;
  }
  local_158 = node;
  BVar10 = BuilderContext::getCurBasicBlock(this->ctx);
  p_Var2 = BVar10._M_node[1]._M_next;
  local_130._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_130._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
  *(_List_node_base **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_130._24_8_ + 0x10))->_M_use_count =
       p_Var2;
  pFVar3 = this->ctx->curFunc;
  local_110 = FunctionModule::pushBackBB(pFVar3);
  hint = this->ctx;
  local_48 = (_Map_pointer)0x0;
  psStack_40 = (_Elt_pointer)0x0;
  local_58._M_unused._M_object = (_Elt_pointer)0x0;
  local_58._8_8_ = (_Elt_pointer)0x0;
  if (((hint->logicalExprInfo).empty == true) &&
     ((hint->logicalExprInfo).empty = false, (hint->logicalExprInfo).inCondition == false)) {
    local_198._0_8_ = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"boolExpAddr","");
    BuilderContext::makeTempLocalReg((BuilderContext *)local_130,(string *)hint);
    local_170 = pFVar3;
    local_a0 = BVar10._M_node;
    if ((Load *)local_198._0_8_ != (Load *)local_188) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
    }
    pBVar4 = this->ctx;
    BVar10._M_node =
         (local_170->bbs).
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    local_198._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8),(Alloca **)local_198,
               (allocator<mocker::ir::Alloca> *)&local_140,(shared_ptr<mocker::ir::Reg> *)local_130)
    ;
    local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_198._0_8_;
    local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
    local_198._0_8_ = (Load *)0x0;
    local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInstFront(pBVar4,BVar10,&local_68);
    pFVar3 = local_170;
    if (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
    }
    local_130._16_8_ = FunctionModule::pushBackBB(pFVar3);
    p_Var2 = ((_List_node_base *)(local_130._16_8_ + 0x10))->_M_next;
    local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    (local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = 1;
    (local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_weak_count = 1;
    (local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
    local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
    ._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
    *(_List_node_base **)
     &local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_use_count = p_Var2;
    pBVar4 = this->ctx;
    local_198._0_8_ = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"v","");
    BuilderContext::makeTempLocalReg((BuilderContext *)local_108,(string *)pBVar4);
    if ((Load *)local_198._0_8_ != (Load *)local_188) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
    }
    pBVar4 = this->ctx;
    local_198._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8),(Load **)local_198,
               (allocator<mocker::ir::Load> *)&local_168,(shared_ptr<mocker::ir::Reg> *)local_108,
               (shared_ptr<mocker::ir::Reg> *)local_130);
    local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_198._0_8_;
    local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
    local_198._0_8_ = (Load *)0x0;
    local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInst(pBVar4,(BBLIter)local_130._16_8_,&local_78);
    pFVar3 = local_170;
    if (local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
    }
    pBVar4 = this->ctx;
    local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_108._0_8_;
    local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
      }
    }
    BuilderContext::setExprAddr(pBVar4,(NodeID)local_158,&local_d8);
    if (local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Jump,std::allocator<mocker::ir::Jump>,std::shared_ptr<mocker::ir::Label>&>
              (&local_160,(Jump **)&local_168,(allocator<mocker::ir::Jump> *)local_198,&local_140);
    BVar10 = FunctionModule::pushBackBB(pFVar3);
    (hint->logicalExprInfo).trueNext._M_node = BVar10._M_node;
    pBVar4 = this->ctx;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_use_count = 1;
    (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_weak_count = 1;
    (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_use_count = 1;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_weak_count = 0;
    local_198._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8),(Store **)local_198,
               (allocator<mocker::ir::Store> *)&local_199,(shared_ptr<mocker::ir::Reg> *)local_130,
               &local_150);
    local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_198._0_8_;
    local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
    local_198._0_8_ = (Load *)0x0;
    local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInst(pBVar4,BVar10,&local_88);
    BVar10._M_node = local_a0;
    pFVar3 = local_170;
    if (local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
    }
    if (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pBVar4 = this->ctx;
    BVar11._M_node = (hint->logicalExprInfo).trueNext._M_node;
    local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_168._M_pi;
    local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_160._M_pi;
    if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
      }
    }
    BuilderContext::appendInst(pBVar4,BVar11,&local_e8);
    if (local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    BVar11 = FunctionModule::pushBackBB(pFVar3);
    *(_List_node_base **)&(hint->logicalExprInfo).falseNext = BVar11._M_node;
    pBVar4 = this->ctx;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_use_count = 1;
    (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_weak_count = 1;
    (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_use_count = 0;
    local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_weak_count = 0;
    local_198._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8),(Store **)local_198,
               (allocator<mocker::ir::Store> *)&local_199,(shared_ptr<mocker::ir::Reg> *)local_130,
               &local_150);
    local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_198._0_8_;
    local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
    local_198._0_8_ = (Load *)0x0;
    local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInst(pBVar4,BVar11,&local_98);
    uVar9 = local_130._16_8_;
    if (local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
    }
    if (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pBVar4 = this->ctx;
    BVar11._M_node =
         (_List_node_base *)
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&(hint->logicalExprInfo).falseNext)->_M_allocated_capacity;
    local_108._16_8_ = local_168._M_pi;
    local_f0 = local_160._M_pi;
    if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
      }
    }
    BuilderContext::appendInst(pBVar4,BVar11,(shared_ptr<mocker::ir::IRInst> *)(local_108 + 0x10));
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    local_b8 = (__node_base_ptr)0x0;
    pAStack_b0 = (ASTIDMap<std::shared_ptr<ast::Type>_> *)0x0;
    _Stack_c0._M_nxt = (_Hash_node_base *)uVar9;
    local_188._8_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp:592:18)>
         ::_M_invoke;
    local_198._8_8_ = uVar9;
    local_188._0_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp:592:18)>
         ::_M_manager;
    local_198._0_8_ = this;
    local_c8 = this;
    Defer::operator=((Defer *)&local_58,(Defer *)local_198);
    Defer::~Defer((Defer *)local_198);
    if (local_b8 != (__node_base_ptr)0x0) {
      (*(code *)local_b8)(&local_c8,&local_c8,3);
    }
    if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
    }
    if (local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_140.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
    }
  }
  BuilderContext::setCurBasicBlock(this->ctx,BVar10);
  bVar7 = (hint->logicalExprInfo).empty;
  uVar8 = *(undefined7 *)&(hint->logicalExprInfo).field_0x1;
  p_Var2 = (hint->logicalExprInfo).trueNext._M_node;
  sVar5 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(hint->logicalExprInfo).falseNext)->_M_allocated_capacity;
  bVar1 = (hint->logicalExprInfo).inCondition;
  if (local_158->op == LogicalOr) {
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(hint->logicalExprInfo).falseNext;
  }
  else {
    if (local_158->op != LogicalAnd) goto LAB_0013f461;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(hint->logicalExprInfo).trueNext;
  }
  *(_List_node_base **)paVar12 = local_110._M_node;
LAB_0013f461:
  peVar6 = (local_158->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar6->super_ASTNode)._vptr_ASTNode[3])
            (peVar6,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  (hint->logicalExprInfo).empty = bVar7;
  *(undefined7 *)&(hint->logicalExprInfo).field_0x1 = uVar8;
  (hint->logicalExprInfo).trueNext._M_node = p_Var2;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&(hint->logicalExprInfo).falseNext)->_M_allocated_capacity = sVar5;
  (hint->logicalExprInfo).inCondition = bVar1;
  BuilderContext::setCurBasicBlock(this->ctx,local_110);
  peVar6 = (local_158->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar6->super_ASTNode)._vptr_ASTNode[3])
            (peVar6,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  Defer::~Defer((Defer *)&local_58);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._24_8_);
  return;
}

Assistant:

void Builder::translateLogicBinary(const ast::BinaryExpr &node) const {
  if (!ctx.getLogicalExprInfo().inCondition) {
    translateEscapedLogicBinary(node);
    return;
  }

  auto originBB = ctx.getCurBasicBlock();
  auto originLabel = getBBLabel(originBB);
  FunctionModule &func = ctx.getCurFunc();
  auto lhsFirstBB = originBB;
  auto rhsFirstBB = func.pushBackBB();
  auto &info = ctx.getLogicalExprInfo();

  Defer undo;
  while (info.empty) {
    info.empty = false;

    if (info.inCondition)
      break;

    auto boolExpAddr = ctx.makeTempLocalReg("boolExpAddr");
    ctx.appendInstFront(func.getFirstBB(),
                        std::make_shared<Alloca>(boolExpAddr));

    auto succBB = func.pushBackBB();
    auto succLabel = getBBLabel(succBB);
    auto val = ctx.makeTempLocalReg("v");
    ctx.appendInst(succBB, std::make_shared<Load>(val, boolExpAddr));
    ctx.setExprAddr(node.getID(), val);

    auto jumpSucc = std::make_shared<Jump>(succLabel);
    info.trueNext = func.pushBackBB();
    ctx.appendInst(
        info.trueNext,
        std::make_shared<Store>(boolExpAddr, std::make_shared<IntLiteral>(1)));
    ctx.appendInst(info.trueNext, jumpSucc);
    info.falseNext = func.pushBackBB();
    ctx.appendInst(
        info.falseNext,
        std::make_shared<Store>(boolExpAddr, std::make_shared<IntLiteral>(0)));
    ctx.appendInst(info.falseNext, jumpSucc);

    undo = Defer([this, succBB] {
      ctx.getLogicalExprInfo().empty = true;
      ctx.setCurBasicBlock(succBB);
    });

    break;
  }

  ctx.setCurBasicBlock(lhsFirstBB);
  auto infoBak = info;
  if (node.op == ast::BinaryExpr::LogicalOr) {
    info.trueNext = infoBak.trueNext;
    info.falseNext = rhsFirstBB;
  } else if (node.op == ast::BinaryExpr::LogicalAnd) {
    info.trueNext = rhsFirstBB;
    info.falseNext = infoBak.falseNext;
  }
  visit(*node.lhs);
  info = infoBak;

  ctx.setCurBasicBlock(rhsFirstBB);
  visit(*node.rhs);
}